

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O2

void __thiscall ANN::ANN(ANN *this,initializer_list<unsigned_int> *n_perceptrons)

{
  uint *puVar1;
  uint *puVar2;
  size_type sVar3;
  uint *puVar4;
  Layer layer;
  
  this->learning_rate = 0.01;
  (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  this->m_dataSet = (DataSet *)0x0;
  this->m_batchSize = 1;
  this->m_lr = 0.01;
  puVar2 = n_perceptrons->_M_array;
  this->m_n_input = *puVar2;
  sVar3 = n_perceptrons->_M_len;
  this->m_n_output = puVar2[sVar3 - 1];
  this->m_batchSize = 1;
  puVar1 = puVar2;
  while (puVar4 = puVar1 + 1, puVar1 != puVar2 + sVar3) {
    layer.m_biases.m_vals.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    layer.m_biases.m_vals.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    layer.m_biases.m_vals.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    layer.m_weights.m_vals.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    layer.m_weights.m_vals.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    layer.m_perceptrons.super__Vector_base<Perceptron,_std::allocator<Perceptron>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    layer.m_weights.m_vals.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    layer.m_perceptrons.super__Vector_base<Perceptron,_std::allocator<Perceptron>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    layer.m_perceptrons.super__Vector_base<Perceptron,_std::allocator<Perceptron>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    Layer::add_perceptron(&layer,*puVar1);
    if (puVar4 != n_perceptrons->_M_array + n_perceptrons->_M_len) {
      Matrix::set_shape(&layer.m_weights,*puVar4,*puVar1);
      Matrix::random_init(&layer.m_weights,-1.0,1.0);
      Matrix::set_shape(&layer.m_biases,1,*puVar4);
      Matrix::random_init(&layer.m_biases,-1.0,1.0);
    }
    std::vector<Layer,_std::allocator<Layer>_>::push_back(&this->m_layers,&layer);
    Layer::~Layer(&layer);
    sVar3 = n_perceptrons->_M_len;
    puVar1 = puVar4;
    puVar2 = n_perceptrons->_M_array;
  }
  return;
}

Assistant:

ANN::ANN(const std::initializer_list<uint>& n_perceptrons){
    auto it=n_perceptrons.begin();
    m_n_input=*n_perceptrons.begin();
    m_n_output=*(n_perceptrons.end()-1);
    m_batchSize=1;
    for(auto it=n_perceptrons.begin();it!=n_perceptrons.end();++it){
        Layer layer;
        layer.add_perceptron(*it);
        if(it+1!=n_perceptrons.end()){
            layer.weights().set_shape(*(it+1), *it);
            layer.weights().random_init(-1., 1.);
            layer.biases().set_shape(1, *(it+1));
            layer.biases().random_init(-1., 1.);
        }
        m_layers.push_back(layer);
    }
}